

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O2

size_t __thiscall
google::protobuf::internal::
MapEntryImpl<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::MessageLite,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
::ByteSizeLong(MapEntryImpl<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::MessageLite,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
               *this)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  ulong uVar3;
  long lVar4;
  long lVar5;
  
  uVar2 = this->_has_bits_[0];
  if ((uVar2 & 1) == 0) {
    lVar5 = 0;
  }
  else {
    iVar1 = (*(this->super_MessageLite)._vptr_MessageLite[0x11])(this);
    uVar3 = *(ulong *)CONCAT44(extraout_var,iVar1) | 1;
    lVar5 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    lVar5 = (ulong)((int)lVar5 * 9 + 0x49U >> 6) + 1;
    uVar2 = this->_has_bits_[0];
  }
  if ((uVar2 & 2) == 0) {
    lVar4 = 0;
  }
  else {
    (*(this->super_MessageLite)._vptr_MessageLite[0x12])(this);
    lVar4 = 9;
  }
  return lVar4 + lVar5;
}

Assistant:

size_t ByteSizeLong() const {
    size_t size = 0;
    size += has_key() ? kTagSize + KeyTypeHandler::ByteSize(key()) : 0;
    size += has_value() ? kTagSize + ValueTypeHandler::ByteSize(value()) : 0;
    return size;
  }